

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnIfExceptExpr
          (BinaryReaderIR *this,Type sig_type,Index except_index)

{
  Index index;
  bool bVar1;
  pointer pIVar2;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_b8;
  Enum local_ac;
  ExprList *local_a8;
  ExprList *expr_list;
  Location local_90;
  Var local_70;
  unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_> local_28;
  unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_> expr;
  Index except_index_local;
  Type sig_type_local;
  BinaryReaderIR *this_local;
  
  expr._M_t.super___uniq_ptr_impl<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_>._M_t
  .super__Tuple_impl<0UL,_wabt::IfExceptExpr_*,_std::default_delete<wabt::IfExceptExpr>_>.
  super__Head_base<0UL,_wabt::IfExceptExpr_*,_false>._M_head_impl._0_4_ = except_index;
  expr._M_t.super___uniq_ptr_impl<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_>._M_t
  .super__Tuple_impl<0UL,_wabt::IfExceptExpr_*,_std::default_delete<wabt::IfExceptExpr>_>.
  super__Head_base<0UL,_wabt::IfExceptExpr_*,_false>._M_head_impl._4_4_ = sig_type;
  MakeUnique<wabt::IfExceptExpr>();
  index = (Index)expr._M_t.
                 super___uniq_ptr_impl<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::IfExceptExpr_*,_std::default_delete<wabt::IfExceptExpr>_>
                 .super__Head_base<0UL,_wabt::IfExceptExpr_*,_false>._M_head_impl;
  GetLocation(&local_90,this);
  Var::Var(&local_70,index,&local_90);
  pIVar2 = std::unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_>::operator->
                     (&local_28);
  Var::operator=(&pIVar2->except_var,&local_70);
  Var::~Var(&local_70);
  pIVar2 = std::unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_>::operator->
                     (&local_28);
  SetBlockDeclaration(this,&(pIVar2->true_).decl,
                      expr._M_t.
                      super___uniq_ptr_impl<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wabt::IfExceptExpr_*,_std::default_delete<wabt::IfExceptExpr>_>
                      .super__Head_base<0UL,_wabt::IfExceptExpr_*,_false>._M_head_impl._4_4_);
  pIVar2 = std::unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_>::operator->
                     (&local_28);
  local_a8 = &(pIVar2->true_).exprs;
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::IfExceptExpr,std::default_delete<wabt::IfExceptExpr>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_b8,&local_28);
  local_ac = (Enum)AppendExpr(this,&local_b8);
  bVar1 = Failed((Result)local_ac);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_b8);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    PushLabel(this,IfExcept,local_a8,(Expr *)0x0);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  std::unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_>::~unique_ptr
            (&local_28);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnIfExceptExpr(Type sig_type, Index except_index) {
  auto expr = MakeUnique<IfExceptExpr>();
  expr->except_var = Var(except_index, GetLocation());
  SetBlockDeclaration(&expr->true_.decl, sig_type);
  ExprList* expr_list = &expr->true_.exprs;
  CHECK_RESULT(AppendExpr(std::move(expr)));
  PushLabel(LabelType::IfExcept, expr_list);
  return Result::Ok;
}